

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::MatMul_x86_avx::forward
          (MatMul_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  size_t sVar1;
  Allocator *pAVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void **ppvVar12;
  pointer pMVar13;
  pointer pMVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  pointer pMVar17;
  pointer pMVar18;
  ulong uVar19;
  int *piVar20;
  Mat *pMVar21;
  size_t sVar22;
  uint uVar23;
  Mat *pMVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  Allocator *pAVar35;
  int iVar36;
  ulong uVar37;
  Mat *pMVar38;
  uint uVar39;
  long lVar40;
  Mat local_1d8;
  ulong local_188;
  ulong local_180;
  Mat *local_178;
  Allocator *local_170;
  Mat *local_168;
  Mat *local_160;
  allocator_type local_151;
  MatMul_x86_avx *local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  int local_130;
  Allocator *local_128;
  int local_120;
  int aiStack_11c [5];
  size_t local_108;
  Allocator *local_100;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  size_t local_b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  int local_80;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  size_t local_58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  
  uVar16 = local_1d8.elemsize._4_4_;
  uVar15 = (undefined4)local_1d8.elemsize;
  pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_160 = pMVar24 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar39 = pMVar24->dims;
  uVar23 = pMVar24[1].dims;
  uVar3 = uVar23;
  if ((int)uVar23 < (int)uVar39) {
    uVar3 = uVar39;
  }
  local_178 = (Mat *)top_blobs;
  local_150 = this;
  if ((uVar39 ^ 1) == 0 && (uVar23 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&_bottom_blobs,2,(allocator_type *)&local_1d8);
    Mat::reshape(&local_1d8,pMVar24,pMVar24->w,1,(Allocator *)0x0);
    pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &local_1d8) {
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar13->cstep = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->c = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar13->data = local_1d8.data;
      pMVar13->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar13->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      pMVar13->elempack = local_1d8.elempack;
      pMVar13->allocator = local_1d8.allocator;
      pMVar13->dims = local_1d8.dims;
      pMVar13->w = local_1d8.w;
      pMVar13->h = local_1d8.h;
      pMVar13->d = local_1d8.d;
      pMVar13->c = local_1d8.c;
      pMVar13->cstep = local_1d8.cstep;
    }
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar28 = 1;
    iVar29 = pMVar24[1].w;
    if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_avx[-3]) == 0) {
      iVar28 = pMVar24[1].w;
      iVar29 = 1;
    }
    Mat::reshape(&local_1d8,local_160,iVar29,iVar28,(Allocator *)0x0);
    piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start + 1 != &local_1d8) {
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].data = local_1d8.data;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].refcount =
           (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elemsize =
           CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].w = local_1d8.w;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].h = local_1d8.h;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].d = local_1d8.d;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].c = local_1d8.c;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
    }
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
    Mat::reshape(&local_1d8,this_00,1,opt->blob_allocator);
    piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (this_00 != &local_1d8) {
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = this_00->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      this_00->data = local_1d8.data;
      this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      this_00->elempack = local_1d8.elempack;
      this_00->allocator = local_1d8.allocator;
      this_00->dims = local_1d8.dims;
      this_00->w = local_1d8.w;
      this_00->h = local_1d8.h;
      this_00->d = local_1d8.d;
      this_00->c = local_1d8.c;
      this_00->cstep = local_1d8.cstep;
    }
    if (piVar20 == (int *)0x0) goto LAB_004b77b8;
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 != 0) goto LAB_004b77b8;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_004b77b8;
    }
  }
  else {
    if ((uVar39 ^ 2) == 0 && (uVar23 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar39 ^ 1) == 0 && (uVar23 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      Mat::reshape(&local_1d8,pMVar24,pMVar24->w,1,(Allocator *)0x0);
      pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != &local_1d8) {
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar13->cstep = 0;
        pMVar13->data = (void *)0x0;
        pMVar13->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
        pMVar13->c = 0;
        pMVar13->dims = 0;
        pMVar13->w = 0;
        pMVar13->h = 0;
        pMVar13->d = 0;
        piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar13->data = local_1d8.data;
        pMVar13->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar13->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        pMVar13->elempack = local_1d8.elempack;
        pMVar13->allocator = local_1d8.allocator;
        pMVar13->dims = local_1d8.dims;
        pMVar13->w = local_1d8.w;
        pMVar13->h = local_1d8.h;
        pMVar13->d = local_1d8.d;
        pMVar13->c = local_1d8.c;
        pMVar13->cstep = local_1d8.cstep;
      }
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar24) {
        piVar20 = pMVar24[1].refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].refcount + 4) = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = (void *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = 0;
        piVar20 = pMVar24[1].refcount;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = pMVar24[1].data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar20;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize = pMVar24[1].elemsize;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = pMVar24[1].elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = pMVar24[1].allocator;
        iVar29 = pMVar24[1].w;
        iVar28 = pMVar24[1].h;
        iVar31 = pMVar24[1].d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = pMVar24[1].dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = iVar29;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = iVar28;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = iVar31;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = pMVar24[1].c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = pMVar24[1].cstep;
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
      Mat::reshape(&local_1d8,this_00,this_00->w,opt->blob_allocator);
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = this_00->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->data = local_1d8.data;
        this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar20 == (int *)0x0) goto LAB_004b77b8;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_004b77b8;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_004b77b8;
      }
    }
    else {
      if ((uVar39 ^ 2) != 0 || (uVar23 ^ 1) != 0) {
        sVar1 = pMVar24->elemsize;
        if ((int)uVar23 < 3 || uVar39 != 1) {
          if ((int)uVar39 < 3 || uVar23 != 1) {
            local_1d8.elemsize._0_4_ = (undefined4)sVar1;
            local_1d8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
            if (uVar3 == 4) {
              if (uVar39 == 3) {
                local_1d8.elemsize._0_4_ = uVar15;
                local_1d8.elemsize._4_4_ = uVar16;
                Mat::reshape(&local_1d8,pMVar24,pMVar24->w,pMVar24->h,pMVar24->c,1,(Allocator *)0x0)
                ;
              }
              else {
                piVar20 = pMVar24->refcount;
                local_1d8.data = pMVar24->data;
                local_1d8.refcount._0_4_ = SUB84(pMVar24->refcount,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
                local_1d8.elempack = pMVar24->elempack;
                local_1d8.allocator = pMVar24->allocator;
                uVar8 = pMVar24->w;
                uVar9 = pMVar24->h;
                uVar10 = pMVar24->d;
                uVar11 = pMVar24->c;
                local_1d8.cstep = pMVar24->cstep;
                local_1d8.dims = uVar39;
                local_1d8.w = uVar8;
                local_1d8.h = uVar9;
                local_1d8.d = uVar10;
                local_1d8.c = uVar11;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + 1;
                  UNLOCK();
                }
              }
              if (uVar23 == 3) {
                Mat::reshape((Mat *)&_bottom_blobs,local_160,pMVar24[1].w,pMVar24[1].h,pMVar24[1].c,
                             1,(Allocator *)0x0);
              }
              else {
                piVar20 = pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar24[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar24[1].elemsize;
                local_130 = pMVar24[1].elempack;
                local_128 = pMVar24[1].allocator;
                local_120 = pMVar24[1].dims;
                aiStack_11c[0] = pMVar24[1].w;
                aiStack_11c[1] = pMVar24[1].h;
                aiStack_11c[2] = pMVar24[1].d;
                aiStack_11c[3] = pMVar24[1].c;
                local_108 = pMVar24[1].cstep;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + 1;
                  UNLOCK();
                }
              }
              uVar39 = aiStack_11c[2];
              if (aiStack_11c[2] < local_1d8.d) {
                uVar39 = local_1d8.d;
              }
              pMVar24 = (Mat *)(ulong)uVar39;
              uVar23 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1d8.c) {
                uVar23 = local_1d8.c;
              }
              pMVar38 = (Mat *)(ulong)uVar23;
              Mat::create(this_00,aiStack_11c
                                  [*(int *)(&local_150->field_0xd0 +
                                           (long)local_150->_vptr_MatMul_x86_avx[-3]) != 0],
                          local_1d8.h,uVar39,uVar23,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_128->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar20 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004b83fc;
              }
              if ((int)uVar39 < 1) {
                pMVar24 = (Mat *)0x0;
              }
              if ((int)uVar23 < 1) {
                pMVar38 = (Mat *)0x0;
              }
              pMVar21 = (Mat *)0x0;
              local_168 = pMVar24;
              while (pMVar21 != pMVar38) {
                local_188 = (ulong)pMVar21 & 0xffffffff;
                local_180 = local_188;
                if (local_1d8.c == 1) {
                  local_180 = 0;
                }
                if (aiStack_11c[3] == 1) {
                  local_188 = 0;
                }
                pMVar24 = (Mat *)0x0;
                local_160 = pMVar21;
                while( true ) {
                  iVar29 = local_1d8.d;
                  if (local_168 == pMVar24) break;
                  iVar30 = aiStack_11c[2];
                  local_178 = pMVar24;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                  pMVar13 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar31 = local_1d8.h;
                  iVar28 = local_1d8.w;
                  pvVar25 = local_1d8.data;
                  lVar26 = (long)local_1d8.w;
                  lVar27 = (long)local_1d8.h;
                  lVar40 = local_1d8.cstep * local_180;
                  sVar1 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                  pMVar24 = local_178;
                  if (iVar29 == 1) {
                    pMVar24 = (Mat *)0x0;
                  }
                  piVar20 = (_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  pAVar35 = local_1d8.allocator;
                  iVar29 = local_1d8.elempack;
                  if (piVar20 != (int *)0x0) {
                    LOCK();
                    *piVar20 = *piVar20 + -1;
                    UNLOCK();
                    if (*piVar20 == 0) {
                      local_100 = local_1d8.allocator;
                      local_170 = (Allocator *)CONCAT44(local_170._4_4_,local_1d8.elempack);
                      if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                        pAVar35 = local_100;
                        iVar29 = (int)local_170;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                        pAVar35 = local_100;
                        iVar29 = (int)local_170;
                      }
                    }
                  }
                  pMVar18 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pMVar14 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pMVar17 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pMVar13->data =
                       (void *)((long)pvVar25 +
                               (long)pMVar24 * lVar27 * lVar26 * sVar1 + lVar40 * sVar1);
                  pMVar13->refcount = (int *)0x0;
                  pMVar13->elemsize = sVar1;
                  pMVar13->elempack = iVar29;
                  pMVar13->allocator = pAVar35;
                  pMVar13->dims = 2;
                  pMVar13->w = iVar28;
                  pMVar13->h = iVar31;
                  pMVar13->d = 1;
                  pMVar13->c = 1;
                  pMVar13->cstep = lVar27 * lVar26;
                  iVar29 = aiStack_11c[1];
                  lVar26 = (long)aiStack_11c[1];
                  lVar27 = local_108 * local_188 *
                           (long)_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                  piVar20 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start[1].refcount;
                  pMVar24 = local_178;
                  if (iVar30 == 1) {
                    pMVar24 = (Mat *)0x0;
                  }
                  pAVar35 = local_128;
                  if (piVar20 != (int *)0x0) {
                    LOCK();
                    *piVar20 = *piVar20 + -1;
                    UNLOCK();
                    if (*piVar20 == 0) {
                      local_170 = local_128;
                      if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0)
                      {
                        free(_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start[1].data);
                        pAVar35 = local_170;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                        pAVar35 = local_170;
                      }
                    }
                  }
                  pMVar18[1].data =
                       (void *)((long)&pMVar17->data +
                               (long)pMVar24 * lVar26 * aiStack_11c[0] * (long)pMVar14 + lVar27);
                  pMVar18[1].refcount = (int *)0x0;
                  pMVar18[1].elemsize = (size_t)pMVar14;
                  pMVar18[1].elempack = local_130;
                  pMVar18[1].allocator = pAVar35;
                  pMVar18[1].dims = 2;
                  pMVar18[1].w = aiStack_11c[0];
                  pMVar18[1].h = iVar29;
                  pMVar18[1].d = 1;
                  pMVar18[1].c = 1;
                  pMVar18[1].cstep = lVar26 * aiStack_11c[0];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                  pMVar13 = _bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar29 = this_00->w;
                  iVar28 = this_00->h;
                  lVar26 = this_00->cstep * (long)local_160;
                  sVar1 = this_00->elemsize;
                  pvVar25 = this_00->data;
                  iVar31 = this_00->elempack;
                  pAVar35 = this_00->allocator;
                  piVar20 = (_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  if (piVar20 != (int *)0x0) {
                    LOCK();
                    *piVar20 = *piVar20 + -1;
                    UNLOCK();
                    if (*piVar20 == 0) {
                      if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                      }
                      else {
                        (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                      }
                    }
                  }
                  pMVar24 = local_178;
                  sVar22 = (long)iVar28 * (long)iVar29;
                  pMVar13->data =
                       (void *)((long)pvVar25 + (long)local_178 * sVar1 * sVar22 + lVar26 * sVar1);
                  pMVar13->refcount = (int *)0x0;
                  pMVar13->elemsize = sVar1;
                  pMVar13->elempack = iVar31;
                  pMVar13->allocator = pAVar35;
                  pMVar13->dims = 2;
                  pMVar13->w = iVar29;
                  pMVar13->h = iVar28;
                  pMVar13->d = 1;
                  pMVar13->c = 1;
                  pMVar13->cstep = sVar22;
                  (*local_150->gemm->_vptr_Layer[6])
                            (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,opt);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                  pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                }
                pMVar21 = (Mat *)((long)&local_160->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_128->_vptr_Allocator[3])();
                  }
                }
              }
              piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar20 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            else {
              if (uVar3 != 3) {
                fprintf(_stderr,"impossible matmul %d %d",(ulong)uVar39,(ulong)uVar23);
                fputc(10,_stderr);
                return -1;
              }
              if (uVar39 == 2) {
                local_1d8.elemsize._0_4_ = uVar15;
                local_1d8.elemsize._4_4_ = uVar16;
                Mat::reshape(&local_1d8,pMVar24,pMVar24->w,pMVar24->h,1,(Allocator *)0x0);
              }
              else {
                piVar20 = pMVar24->refcount;
                local_1d8.data = pMVar24->data;
                local_1d8.refcount._0_4_ = SUB84(pMVar24->refcount,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
                local_1d8.elempack = pMVar24->elempack;
                local_1d8.allocator = pMVar24->allocator;
                uVar4 = pMVar24->w;
                uVar5 = pMVar24->h;
                uVar6 = pMVar24->d;
                uVar7 = pMVar24->c;
                local_1d8.cstep = pMVar24->cstep;
                local_1d8.dims = uVar39;
                local_1d8.w = uVar4;
                local_1d8.h = uVar5;
                local_1d8.d = uVar6;
                local_1d8.c = uVar7;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + 1;
                  UNLOCK();
                }
              }
              if (uVar23 == 2) {
                Mat::reshape((Mat *)&_bottom_blobs,local_160,pMVar24[1].w,pMVar24[1].h,1,
                             (Allocator *)0x0);
              }
              else {
                piVar20 = pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar24[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar24[1].elemsize;
                local_130 = pMVar24[1].elempack;
                local_128 = pMVar24[1].allocator;
                local_120 = pMVar24[1].dims;
                aiStack_11c[0] = pMVar24[1].w;
                aiStack_11c[1] = pMVar24[1].h;
                aiStack_11c[2] = pMVar24[1].d;
                aiStack_11c[3] = pMVar24[1].c;
                local_108 = pMVar24[1].cstep;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + 1;
                  UNLOCK();
                }
              }
              uVar39 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1d8.c) {
                uVar39 = local_1d8.c;
              }
              pMVar24 = (Mat *)(ulong)uVar39;
              Mat::create(this_00,aiStack_11c
                                  [*(int *)(&local_150->field_0xd0 +
                                           (long)local_150->_vptr_MatMul_x86_avx[-3]) != 0],
                          local_1d8.h,uVar39,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_128->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar20 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
LAB_004b83fc:
                free(local_1d8.data);
                return -100;
              }
              if ((int)uVar39 < 1) {
                pMVar24 = (Mat *)0x0;
              }
              pMVar38 = (Mat *)0x0;
              local_160 = pMVar24;
              while( true ) {
                iVar28 = aiStack_11c[3];
                iVar29 = local_1d8.c;
                if (local_160 == pMVar38) break;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                pMVar13 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar30 = local_1d8.dims;
                iVar31 = local_1d8.elempack;
                uVar37 = (ulong)local_1d8.w;
                uVar19 = (ulong)local_1d8.h;
                pMVar24 = pMVar38;
                if (iVar29 == 1) {
                  pMVar24 = (Mat *)0x0;
                }
                uVar32 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                pvVar25 = (void *)((long)pMVar24 * local_1d8.cstep * uVar32 + (long)local_1d8.data);
                uVar33 = (uVar32 * uVar19 * uVar37 + 0xf & 0xfffffffffffffff0) / uVar32;
                if (local_1d8.dims == 4) {
                  uVar33 = uVar19 * uVar37;
                }
                piVar20 = (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                pAVar35 = local_1d8.allocator;
                uVar39 = local_1d8.d;
                iVar29 = local_1d8.w;
                iVar36 = local_1d8.h;
                local_178 = pMVar38;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + -1;
                  UNLOCK();
                  if (*piVar20 == 0) {
                    local_170 = local_1d8.allocator;
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,local_1d8.d);
                    local_180 = uVar37;
                    local_188 = uVar19;
                    if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                      free((_bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      iVar29 = (int)local_180;
                      iVar36 = (int)local_188;
                      pAVar35 = local_170;
                      uVar39 = (uint)local_168;
                    }
                    else {
                      (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])()
                      ;
                      iVar29 = (int)local_180;
                      iVar36 = (int)local_188;
                      pAVar35 = local_170;
                      uVar39 = (uint)local_168;
                    }
                  }
                }
                pMVar14 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar17 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                pMVar13->refcount = (int *)0x0;
                pMVar13->data = pvVar25;
                pMVar13->elemsize = uVar32;
                pMVar13->elempack = iVar31;
                pMVar13->allocator = pAVar35;
                pMVar13->dims = iVar30 - 1;
                pMVar13->w = iVar29;
                pMVar13->h = iVar36;
                pMVar13->d = 1;
                pMVar13->c = uVar39;
                pMVar13->cstep = uVar33;
                uVar37 = (ulong)aiStack_11c[0];
                iVar29 = aiStack_11c[1];
                pMVar24 = local_178;
                if (iVar28 == 1) {
                  pMVar24 = (Mat *)0x0;
                }
                lVar26 = (long)pMVar24 * local_108 *
                         (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                ppvVar12 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data;
                uVar32 = (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage *
                         (long)aiStack_11c[1] * uVar37 + 0xf & 0xfffffffffffffff0;
                uVar19 = uVar32 / (ulong)_bottom_blobs.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_120 == 4) {
                  uVar19 = (long)aiStack_11c[1] * uVar37;
                }
                piVar20 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].refcount;
                iVar31 = aiStack_11c[2];
                iVar28 = aiStack_11c[0];
                iVar30 = local_130;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + -1;
                  UNLOCK();
                  if (*piVar20 == 0) {
                    local_188 = CONCAT44(local_188._4_4_,local_130);
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,aiStack_11c[2]);
                    pAVar35 = _bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start[1].allocator;
                    local_180 = uVar37;
                    if (pAVar35 == (Allocator *)0x0) {
                      free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].data);
                      iVar28 = (int)local_180;
                      iVar31 = (uint)local_168;
                      iVar30 = (int)local_188;
                    }
                    else {
                      (*pAVar35->_vptr_Allocator[3])
                                (pAVar35,_bottom_blobs_5.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start[1].data,
                                 uVar32 % (ulong)_bottom_blobs.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                      ;
                      iVar28 = (int)local_180;
                      iVar31 = (uint)local_168;
                      iVar30 = (int)local_188;
                    }
                  }
                }
                pMVar14[1].data = (void **)((long)ppvVar12 + lVar26);
                pMVar14[1].refcount = (int *)0x0;
                pMVar14[1].elemsize = (size_t)pMVar17;
                pMVar14[1].elempack = iVar30;
                pMVar14[1].allocator = local_128;
                pMVar14[1].dims = local_120 + -1;
                pMVar14[1].w = iVar28;
                pMVar14[1].h = iVar29;
                pMVar14[1].d = 1;
                pMVar14[1].c = iVar31;
                pMVar14[1].cstep = uVar19;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                uVar19 = (ulong)this_00->w;
                iVar29 = this_00->h;
                iVar28 = this_00->d;
                lVar26 = this_00->cstep * (long)local_178;
                uVar37 = this_00->elemsize;
                pvVar25 = this_00->data;
                iVar31 = this_00->elempack;
                pAVar35 = this_00->allocator;
                uVar34 = (long)iVar29 * uVar19;
                uVar33 = uVar34 * uVar37 + 0xf & 0xfffffffffffffff0;
                iVar30 = this_00->dims;
                uVar32 = uVar33 / uVar37;
                if (iVar30 == 4) {
                  uVar32 = uVar34;
                }
                piVar20 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + -1;
                  UNLOCK();
                  if (*piVar20 == 0) {
                    local_188 = CONCAT44(local_188._4_4_,iVar31);
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,iVar28);
                    pAVar2 = (_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->allocator;
                    local_180 = uVar19;
                    if (pAVar2 == (Allocator *)0x0) {
                      free((_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      uVar19 = local_180;
                      iVar28 = (uint)local_168;
                      iVar31 = (int)local_188;
                    }
                    else {
                      (*pAVar2->_vptr_Allocator[3])
                                (pAVar2,(_bottom_blobs_3.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->data,
                                 uVar33 % uVar37);
                      uVar19 = local_180;
                      iVar28 = (uint)local_168;
                      iVar31 = (int)local_188;
                    }
                  }
                }
                pMVar13->data = (void *)(lVar26 * uVar37 + (long)pvVar25);
                pMVar13->refcount = (int *)0x0;
                pMVar13->elemsize = uVar37;
                pMVar13->elempack = iVar31;
                pMVar13->allocator = pAVar35;
                pMVar13->dims = iVar30 + -1;
                pMVar13->w = (int)uVar19;
                pMVar13->h = iVar29;
                pMVar13->d = 1;
                pMVar13->c = iVar28;
                pMVar13->cstep = uVar32;
                (*local_150->gemm->_vptr_Layer[6])
                          (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,opt);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                pMVar38 = (Mat *)((long)&local_178->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_128->_vptr_Allocator[3])();
                  }
                }
              }
              piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar20 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            goto LAB_004b8876;
          }
          uVar23 = pMVar24->c * pMVar24->d;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          local_100 = (Allocator *)CONCAT44(local_100._4_4_,pMVar24->h);
          Mat::create(&local_1d8,1,pMVar24->h,uVar23,sVar1,opt->blob_allocator);
          if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
            piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar20 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 != 0) {
              return -100;
            }
            if (local_1d8.allocator != (Allocator *)0x0) {
              (*(local_1d8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
            goto LAB_004b83fc;
          }
          Mat::reshape((Mat *)&_bottom_blobs,pMVar24,pMVar24->w,pMVar24->h,uVar23,(Allocator *)0x0);
          iVar28 = 1;
          iVar29 = pMVar24[1].w;
          if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_avx[-3]) == 0) {
            iVar28 = pMVar24[1].w;
            iVar29 = 1;
          }
          pMVar38 = (Mat *)0x0;
          Mat::reshape((Mat *)&_bottom_blobs_5,local_160,iVar29,iVar28,(Allocator *)0x0);
          local_160 = (Mat *)(ulong)uVar23;
          if ((int)uVar23 < 1) {
            local_160 = pMVar38;
          }
          while( true ) {
            if (local_160 == pMVar38) break;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
            pMVar17 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar33 = (ulong)aiStack_11c[0];
            uVar37 = (ulong)aiStack_11c[1];
            lVar26 = local_108 * (long)pMVar38 *
                     (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppvVar12 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->data;
            uVar32 = (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * uVar37 * uVar33 + 0xf
                     & 0xfffffffffffffff0;
            uVar19 = uVar32 / (ulong)_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_120 == 4) {
              uVar19 = uVar37 * uVar33;
            }
            piVar20 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            pAVar35 = local_128;
            iVar28 = aiStack_11c[2];
            iVar29 = aiStack_11c[0];
            local_178 = pMVar38;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                local_170 = local_128;
                local_168 = (Mat *)CONCAT44(local_168._4_4_,aiStack_11c[2]);
                pAVar35 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar33;
                local_188 = uVar37;
                if (pAVar35 == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                  iVar29 = (int)local_180;
                  uVar37 = local_188;
                  pAVar35 = local_170;
                  iVar28 = (uint)local_168;
                }
                else {
                  (*pAVar35->_vptr_Allocator[3])
                            (pAVar35,(_bottom_blobs_3.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar32 % (ulong)_bottom_blobs.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar29 = (int)local_180;
                  uVar37 = local_188;
                  pAVar35 = local_170;
                  iVar28 = (uint)local_168;
                }
              }
            }
            pMVar14 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar38 = local_178;
            pMVar17->data = (void **)((long)ppvVar12 + lVar26);
            pMVar17->refcount = (int *)0x0;
            pMVar17->elemsize = (size_t)pMVar13;
            pMVar17->elempack = local_130;
            pMVar17->allocator = pAVar35;
            pMVar17->dims = local_120 + -1;
            pMVar17->w = iVar29;
            pMVar17->h = (int)uVar37;
            pMVar17->d = 1;
            pMVar17->c = iVar28;
            pMVar17->cstep = uVar19;
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start + 1 != (pointer)&_bottom_blobs_5) {
              if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_5.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar20 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].refcount;
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                    free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].data);
                  }
                  else {
                    (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])()
                    ;
                  }
                }
              }
              pMVar14[1].data =
                   _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pMVar14[1].refcount =
                   (int *)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              pMVar14[1].elemsize =
                   (size_t)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pMVar14[1].elempack = local_80;
              pMVar14[1].allocator = local_78;
              pMVar14[1].dims = local_70;
              pMVar14[1].w = iStack_6c;
              pMVar14[1].h = iStack_68;
              pMVar14[1].d = iStack_64;
              pMVar14[1].c = local_60;
              pMVar14[1].cstep = local_58;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_151);
            pMVar13 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar28 = local_1d8.dims;
            iVar29 = local_1d8.elempack;
            uVar34 = (ulong)local_1d8.w;
            uVar19 = (ulong)local_1d8.h;
            uVar37 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
            pvVar25 = (void *)(local_1d8.cstep * (long)pMVar38 * uVar37 + (long)local_1d8.data);
            uVar33 = uVar37 * uVar19 * uVar34 + 0xf & 0xfffffffffffffff0;
            uVar32 = uVar33 / uVar37;
            if (local_1d8.dims == 4) {
              uVar32 = uVar19 * uVar34;
            }
            piVar20 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            pAVar35 = local_1d8.allocator;
            uVar23 = local_1d8.d;
            iVar31 = local_1d8.w;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                local_170 = local_1d8.allocator;
                local_168 = (Mat *)CONCAT44(local_168._4_4_,local_1d8.d);
                pAVar35 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar34;
                local_188 = uVar19;
                if (pAVar35 == (Allocator *)0x0) {
                  free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                        .super__Vector_impl_data._M_start)->data);
                  iVar31 = (int)local_180;
                  uVar19 = local_188;
                  pAVar35 = local_170;
                  uVar23 = (uint)local_168;
                }
                else {
                  (*pAVar35->_vptr_Allocator[3])
                            (pAVar35,(_top_blobs.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar33 % uVar37);
                  iVar31 = (int)local_180;
                  uVar19 = local_188;
                  pAVar35 = local_170;
                  uVar23 = (uint)local_168;
                }
              }
            }
            pMVar13->data = pvVar25;
            pMVar13->refcount = (int *)0x0;
            pMVar13->elemsize = uVar37;
            pMVar13->elempack = iVar29;
            pMVar13->allocator = pAVar35;
            pMVar13->dims = iVar28 - 1;
            pMVar13->w = iVar31;
            pMVar13->h = (int)uVar19;
            pMVar13->d = 1;
            pMVar13->c = uVar23;
            pMVar13->cstep = uVar32;
            (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs_3,&_top_blobs,opt);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
            pMVar38 = (Mat *)((long)&local_178->data + 1);
          }
          if (uVar39 == 3) {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar24->c * pMVar24->d,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar20 = this_00->refcount;
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) {
LAB_004b87cf:
                  free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar24->d,pMVar24->c,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar20 = this_00->refcount;
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) goto LAB_004b87cf;
                (*local_d8->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_78 == (Allocator *)0x0) {
                free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_78->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_128 == (Allocator *)0x0) {
                free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_start);
              }
              else {
                (*local_128->_vptr_Allocator[3])();
              }
            }
          }
          piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar20 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 != 0) {
            return 0;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_004b8876;
        }
        uVar39 = pMVar24[1].c * pMVar24[1].d;
        local_1d8.cstep = 0;
        local_1d8.data = (void *)0x0;
        local_1d8.refcount._0_4_ = 0;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.elemsize._0_4_ = 0;
        local_1d8.elemsize._4_4_ = 0;
        local_1d8.elempack = 0;
        local_1d8.allocator = (Allocator *)0x0;
        local_1d8.dims = 0;
        local_1d8.w = 0;
        local_1d8.h = 0;
        local_1d8.d = 0;
        local_1d8.c = 0;
        local_100 = (Allocator *)
                    CONCAT44(local_100._4_4_,
                             (&pMVar24[1].w)
                             [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_avx[-3]) !=
                              0]);
        Mat::create(&local_1d8,
                    (&pMVar24[1].w)
                    [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_avx[-3]) != 0],1,
                    uVar39,sVar1,opt->blob_allocator);
        if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
          piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar20 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 != 0) {
            return -100;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return -100;
          }
          goto LAB_004b83fc;
        }
        Mat::reshape((Mat *)&_bottom_blobs,pMVar24,pMVar24->w,1,(Allocator *)0x0);
        pMVar38 = (Mat *)0x0;
        Mat::reshape((Mat *)&_bottom_blobs_5,local_160,pMVar24[1].w,pMVar24[1].h,uVar39,
                     (Allocator *)0x0);
        local_160 = (Mat *)(ulong)uVar39;
        if ((int)uVar39 < 1) {
          local_160 = pMVar38;
        }
        local_168 = (Mat *)CONCAT44(local_168._4_4_,uVar23);
        while (local_160 != pMVar38) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
          pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)&_bottom_blobs) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar20 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                }
                else {
                  (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar13->cstep = 0;
            pMVar13->data = (void *)0x0;
            pMVar13->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
            pMVar13->c = 0;
            pMVar13->dims = 0;
            pMVar13->w = 0;
            pMVar13->h = 0;
            pMVar13->d = 0;
            pMVar13->data =
                 _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pMVar13->refcount =
                 (int *)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            pMVar13->elemsize =
                 (size_t)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            pMVar13->elempack = local_130;
            pMVar13->allocator = local_128;
            pMVar13->dims = local_120;
            pMVar13->w = aiStack_11c[0];
            pMVar13->h = aiStack_11c[1];
            pMVar13->d = aiStack_11c[2];
            pMVar13->c = aiStack_11c[3];
            pMVar13->cstep = local_108;
          }
          pMVar17 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar32 = (ulong)iStack_6c;
          lVar26 = local_58 * (long)pMVar38 *
                   (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppvVar12 = &(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data;
          uVar19 = (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                   (long)iStack_68 * uVar32 + 0xf & 0xfffffffffffffff0;
          uVar37 = uVar19 / (ulong)_bottom_blobs_5.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
          if (local_70 == 4) {
            uVar37 = (long)iStack_68 * uVar32;
          }
          piVar20 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pAVar35 = local_78;
          iVar28 = iStack_64;
          iVar29 = iStack_6c;
          local_178 = pMVar38;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              local_170 = local_78;
              local_180 = CONCAT44(local_180._4_4_,iStack_64);
              pAVar35 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].allocator;
              local_188 = uVar32;
              if (pAVar35 == (Allocator *)0x0) {
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
                iVar29 = (int)local_188;
                pAVar35 = local_170;
                iVar28 = (uint)local_180;
              }
              else {
                (*pAVar35->_vptr_Allocator[3])
                          (pAVar35,_bottom_blobs_3.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start[1].data,
                           uVar19 % (ulong)_bottom_blobs_5.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar29 = (int)local_188;
                pAVar35 = local_170;
                iVar28 = (uint)local_180;
              }
            }
          }
          pMVar13[1].data = (void **)((long)ppvVar12 + lVar26);
          pMVar13[1].refcount = (int *)0x0;
          pMVar13[1].elemsize = (size_t)pMVar17;
          pMVar13[1].elempack = local_80;
          pMVar13[1].allocator = pAVar35;
          pMVar13[1].dims = local_70 + -1;
          pMVar13[1].w = iVar29;
          pMVar13[1].h = iStack_68;
          pMVar13[1].d = 1;
          pMVar13[1].c = iVar28;
          pMVar13[1].cstep = uVar37;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_151);
          pMVar13 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar31 = local_1d8.h;
          iVar28 = local_1d8.dims;
          iVar29 = local_1d8.elempack;
          uVar33 = (ulong)local_1d8.w;
          uVar37 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
          pvVar25 = (void *)(local_1d8.cstep * (long)local_178 * uVar37 + (long)local_1d8.data);
          uVar32 = uVar37 * (long)local_1d8.h * uVar33 + 0xf & 0xfffffffffffffff0;
          uVar19 = uVar32 / uVar37;
          if (local_1d8.dims == 4) {
            uVar19 = (long)local_1d8.h * uVar33;
          }
          piVar20 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->refcount;
          pAVar35 = local_1d8.allocator;
          uVar39 = local_1d8.d;
          iVar30 = local_1d8.w;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              local_170 = local_1d8.allocator;
              local_180 = CONCAT44(local_180._4_4_,local_1d8.d);
              pAVar35 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator;
              local_188 = uVar33;
              if (pAVar35 == (Allocator *)0x0) {
                free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->data);
                iVar30 = (int)local_188;
                pAVar35 = local_170;
                uVar39 = (uint)local_180;
              }
              else {
                (*pAVar35->_vptr_Allocator[3])
                          (pAVar35,(_top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data,uVar32 % uVar37)
                ;
                iVar30 = (int)local_188;
                pAVar35 = local_170;
                uVar39 = (uint)local_180;
              }
            }
          }
          pMVar13->data = pvVar25;
          pMVar13->refcount = (int *)0x0;
          pMVar13->elemsize = uVar37;
          pMVar13->elempack = iVar29;
          pMVar13->allocator = pAVar35;
          pMVar13->dims = iVar28 - 1;
          pMVar13->w = iVar30;
          pMVar13->h = iVar31;
          pMVar13->d = 1;
          pMVar13->c = uVar39;
          pMVar13->cstep = uVar19;
          (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs_3,&_top_blobs,opt);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          uVar23 = (uint)local_168;
          pMVar38 = (Mat *)((long)&local_178->data + 1);
        }
        if (uVar23 == 3) {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar24[1].c * pMVar24[1].d
                       ,opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar20 = this_00->refcount;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) {
LAB_004b8571:
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_d8->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar24[1].d,pMVar24[1].c,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar20 = this_00->refcount;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) goto LAB_004b8571;
              (*local_d8->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_78 == (Allocator *)0x0) {
              free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start);
            }
            else {
              (*local_78->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_128 == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              (*local_128->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar20 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 != 0) {
          return 0;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return 0;
        }
LAB_004b8876:
        free(local_1d8.data);
        return 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar24) {
        piVar20 = pMVar24->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar13->cstep = 0;
        pMVar13->data = (void *)0x0;
        pMVar13->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
        pMVar13->c = 0;
        pMVar13->dims = 0;
        pMVar13->w = 0;
        pMVar13->h = 0;
        pMVar13->d = 0;
        piVar20 = pMVar24->refcount;
        pMVar13->data = pMVar24->data;
        pMVar13->refcount = piVar20;
        pMVar13->elemsize = pMVar24->elemsize;
        pMVar13->elempack = pMVar24->elempack;
        pMVar13->allocator = pMVar24->allocator;
        iVar29 = pMVar24->w;
        iVar28 = pMVar24->h;
        iVar31 = pMVar24->d;
        pMVar13->dims = pMVar24->dims;
        pMVar13->w = iVar29;
        pMVar13->h = iVar28;
        pMVar13->d = iVar31;
        pMVar13->c = pMVar24->c;
        pMVar13->cstep = pMVar24->cstep;
      }
      iVar28 = 1;
      iVar29 = pMVar24[1].w;
      if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_avx[-3]) == 0) {
        iVar28 = pMVar24[1].w;
        iVar29 = 1;
      }
      Mat::reshape(&local_1d8,local_160,iVar29,iVar28,(Allocator *)0x0);
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start + 1 != &local_1d8) {
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = local_1d8.data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount =
             (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = local_1d8.w;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = local_1d8.h;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = local_1d8.d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = local_1d8.c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
      }
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
      Mat::reshape(&local_1d8,this_00,this_00->h,opt->blob_allocator);
      piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = this_00->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->data = local_1d8.data;
        this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar20 == (int *)0x0) goto LAB_004b77b8;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_004b77b8;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_004b77b8;
      }
    }
  }
  free(local_1d8.data);
LAB_004b77b8:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs);
  return 0;
}

Assistant:

int MatMul_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}